

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void frozen_serialization_compare(roaring_bitmap_t *r1)

{
  roaring_bitmap_t *r2_00;
  char *expression;
  roaring_bitmap_t *file;
  roaring_bitmap_t *in_RDI;
  roaring_bitmap_t *r2;
  char *buf;
  size_t num_bytes;
  size_t in_stack_00000080;
  char *in_stack_00000088;
  roaring_bitmap_t *in_stack_00000090;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  size_t in_stack_ffffffffffffffe0;
  
  r2_00 = (roaring_bitmap_t *)roaring_bitmap_frozen_size_in_bytes(in_RDI);
  expression = (char *)roaring_aligned_malloc
                                 (in_stack_ffffffffffffffe0,
                                  CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  roaring_bitmap_frozen_serialize(in_stack_00000090,in_stack_00000088);
  file = roaring_bitmap_frozen_view(in_stack_00000088,in_stack_00000080);
  roaring_bitmap_equals(in_RDI,r2_00);
  _assert_true((unsigned_long)r2_00,expression,(char *)file,in_stack_ffffffffffffffdc);
  roaring_bitmap_frozen_view(in_stack_00000088,in_stack_00000080);
  _assert_true((unsigned_long)r2_00,expression,(char *)file,in_stack_ffffffffffffffdc);
  roaring_bitmap_free((roaring_bitmap_t *)0x10a8c5);
  roaring_bitmap_free((roaring_bitmap_t *)0x10a8cf);
  roaring_aligned_free((void *)0x10a8d9);
  return;
}

Assistant:

void frozen_serialization_compare(roaring_bitmap_t *r1) {
    size_t num_bytes = roaring_bitmap_frozen_size_in_bytes(r1);
    char *buf = (char *)roaring_aligned_malloc(32, num_bytes);
    roaring_bitmap_frozen_serialize(r1, buf);

    const roaring_bitmap_t *r2 = roaring_bitmap_frozen_view(buf, num_bytes);

    assert_true(roaring_bitmap_equals(r1, r2));
    assert_true(roaring_bitmap_frozen_view(buf + 1, num_bytes - 1) == NULL);

    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);
    roaring_aligned_free(buf);
}